

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O3

void __thiscall cinatra::http_parser::parse_query(http_parser *this,string_view str)

{
  long lVar1;
  ulong __n_00;
  char *__s;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_type __n;
  pointer pbVar5;
  string_view delimiter;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  vec;
  ulong local_68;
  char *pcStack_60;
  ulong local_58;
  char *pcStack_50;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_48;
  
  local_68 = 0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  pcStack_50 = (char *)0x0;
  delimiter._M_str = "&";
  delimiter._M_len = 1;
  split_sv(&local_48,str,delimiter);
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_48.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __n_00 = pbVar5->_M_len;
      if (__n_00 != 0) {
        __s = pbVar5->_M_str;
        pcVar2 = (char *)memchr(__s,0x3d,__n_00);
        uVar4 = (long)pcVar2 - (long)__s;
        pcStack_60 = __s;
        if (uVar4 == 0xffffffffffffffff || pcVar2 == (char *)0x0) {
          local_58 = 0;
          pcStack_50 = "";
          local_68 = __n_00;
        }
        else {
          local_68 = uVar4;
          if (__n_00 < uVar4) {
            local_68 = __n_00;
          }
          if (pcVar2 == __s) goto LAB_00123cdd;
          lVar1 = uVar4 + 1;
          uVar3 = __n_00 - uVar4;
          if (__n_00 < uVar4 || uVar3 == 0) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",lVar1,__n_00);
          }
          local_58 = __n_00 - lVar1;
          if (uVar3 <= __n_00 - lVar1) {
            local_58 = uVar3;
          }
          pcStack_50 = __s + lVar1;
        }
        std::
        _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->queries_,&local_68,&local_58);
      }
LAB_00123cdd:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_48.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void parse_query(std::string_view str) {
    std::string_view key;
    std::string_view val;

    auto vec = split_sv(str, "&");
    for (auto s : vec) {
      if (s.empty()) {
        continue;
      }
      size_t pos = s.find('=');
      if (s.find('=') != std::string_view::npos) {
        key = s.substr(0, pos);
        if (key.empty()) {
          continue;
        }
        val = s.substr(pos + 1, s.length() - pos);
      }
      else {
        key = s;
        val = "";
      }
      queries_.emplace(key, val);
    }
  }